

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O2

void test_cpp_wrapper_all_records_random(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  int i;
  long lVar1;
  int records [5];
  
  records[0] = -0x6f;
  records[1] = 0x71;
  records[2] = 5;
  records[3] = 0x32;
  records[4] = -0xe1;
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    cpp_wrapper_insert(tc,dict,records[lVar1],records[lVar1],'\x01');
  }
  cpp_wrapper_all_records(tc,dict,records,5,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_all_records_random(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	int records[5]		= { -111, 113, 5, 50, -225 };
	int records_length	= sizeof(records) / sizeof(int);

	for (int i = 0; i < records_length; i++) {
		cpp_wrapper_insert(tc, dict, records[i], records[i], boolean_true);
	}

	cpp_wrapper_all_records(tc, dict, records, records_length, boolean_true);
}